

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCameraSceneNode.cpp
# Opt level: O0

void __thiscall
irr::scene::CCameraSceneNode::setRotation(CCameraSceneNode *this,vector3df *rotation)

{
  vector3df *in_RSI;
  ISceneNode *in_RDI;
  vector3d<float> vVar1;
  vector3d<float> *in_stack_00000008;
  vector3d<float> *in_stack_00000010;
  vector3d<float> *this_00;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  vector3d<float> local_54;
  undefined8 local_48;
  float local_40;
  undefined8 local_1c;
  float local_14;
  vector3df *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI[2].field_0x95 & 1) != 0) {
    (*in_RDI->_vptr_ISceneNode[0x1d])();
    this_00 = &local_54;
    core::vector3d<float>::vector3d(this_00,0.0,0.0,1.0);
    vVar1 = core::vector3d<float>::rotationToDirection(in_stack_00000010,in_stack_00000008);
    local_60 = vVar1.Z;
    local_40 = local_60;
    local_68 = vVar1._0_8_;
    local_48 = local_68;
    vVar1 = core::vector3d<float>::operator+((vector3d<float> *)in_RDI,this_00);
    local_78 = vVar1._0_8_;
    local_1c = local_78;
    local_70 = vVar1.Z;
    local_14 = local_70;
    *(undefined8 *)
     ((long)&in_RDI[1].Name.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload + 4) = local_78;
    *(float *)((long)&in_RDI[1].Name.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0xc) = local_70;
  }
  ISceneNode::setRotation(in_RDI,local_10);
  return;
}

Assistant:

void CCameraSceneNode::setRotation(const core::vector3df &rotation)
{
	if (TargetAndRotationAreBound)
		Target = getAbsolutePosition() + rotation.rotationToDirection();

	ISceneNode::setRotation(rotation);
}